

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSampleImages.cpp
# Opt level: O3

void anon_unknown.dwarf_291a09::compareImages(char *fileName1,char *fileName2)

{
  int iVar1;
  size_t sVar2;
  Box2i *pBVar3;
  Box2i *pBVar4;
  void *pvVar5;
  void *pvVar6;
  undefined4 in_ECX;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  size_t yStride;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  float fVar14;
  RgbaInputFile in1;
  RgbaInputFile in2;
  RgbaInputFile local_a0;
  RgbaInputFile local_68;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing files ",0x10);
  if (fileName1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x4a6370);
  }
  else {
    sVar2 = strlen(fileName1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,fileName1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and ",5);
  if (fileName2 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x4a6370);
  }
  else {
    sVar2 = strlen(fileName2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,fileName2,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  iVar1 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile(&local_a0,fileName1,iVar1);
  iVar1 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile(&local_68,fileName1,iVar1);
  pBVar3 = Imf_2_5::RgbaInputFile::dataWindow(&local_a0);
  pBVar4 = Imf_2_5::RgbaInputFile::dataWindow(&local_68);
  iVar1 = -(uint)((pBVar4->min).x == (pBVar3->min).x);
  iVar13 = -(uint)((pBVar4->min).y == (pBVar3->min).y);
  auVar11._4_4_ = iVar1;
  auVar11._0_4_ = iVar1;
  auVar11._8_4_ = iVar13;
  auVar11._12_4_ = iVar13;
  iVar1 = movmskpd(in_ECX,auVar11);
  if ((iVar1 != 3) ||
     (iVar1 = -(uint)((pBVar4->max).x == (pBVar3->max).x),
     iVar13 = -(uint)((pBVar4->max).y == (pBVar3->max).y), auVar12._4_4_ = iVar1,
     auVar12._0_4_ = iVar1, auVar12._8_4_ = iVar13, auVar12._12_4_ = iVar13,
     iVar1 = movmskpd((int)pBVar4,auVar12), iVar1 != 3)) {
    __assert_fail("in1.dataWindow() == in2.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                  ,0x6d,"void (anonymous namespace)::compareImages(const char *, const char *)");
  }
  pBVar3 = Imf_2_5::RgbaInputFile::dataWindow(&local_a0);
  lVar10 = (long)(pBVar3->min).x;
  yStride = ((pBVar3->max).x - lVar10) + 1;
  iVar1 = (pBVar3->min).y;
  uVar9 = (((pBVar3->max).y - iVar1) + 1) * (int)yStride;
  uVar7 = 0xffffffffffffffff;
  if (-1 < (int)uVar9) {
    uVar7 = (long)(int)uVar9 * 8;
  }
  pvVar5 = operator_new__(uVar7);
  pvVar6 = operator_new__(uVar7);
  lVar8 = (long)(iVar1 * (int)yStride);
  Imf_2_5::RgbaInputFile::setFrameBuffer
            (&local_a0,(Rgba *)((long)pvVar5 + lVar8 * -8 + lVar10 * -8),1,yStride);
  Imf_2_5::RgbaInputFile::setFrameBuffer
            (&local_68,(Rgba *)((long)pvVar6 + lVar8 * -8 + lVar10 * -8),1,yStride);
  pBVar3 = Imf_2_5::RgbaInputFile::dataWindow(&local_a0);
  iVar1 = (pBVar3->min).y;
  pBVar3 = Imf_2_5::RgbaInputFile::dataWindow(&local_a0);
  Imf_2_5::RgbaInputFile::readPixels(&local_a0,iVar1,(pBVar3->max).y);
  pBVar3 = Imf_2_5::RgbaInputFile::dataWindow(&local_68);
  iVar1 = (pBVar3->min).y;
  pBVar3 = Imf_2_5::RgbaInputFile::dataWindow(&local_68);
  Imf_2_5::RgbaInputFile::readPixels(&local_68,iVar1,(pBVar3->max).y);
  if (0 < (int)uVar9) {
    uVar7 = 0;
    do {
      fVar14 = (half::_toFloat[*(ushort *)((long)pvVar5 + uVar7 * 8)].f + 0.01) /
               (half::_toFloat[*(ushort *)((long)pvVar6 + uVar7 * 8)].f + 0.01);
      if ((fVar14 < 0.99) || (1.01 < fVar14)) {
        __assert_fail("approximatelyEqual (pixels1[i].r, pixels2[i].r)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                      ,0x81,"void (anonymous namespace)::compareImages(const char *, const char *)")
        ;
      }
      fVar14 = (half::_toFloat[*(ushort *)((long)pvVar5 + uVar7 * 8 + 2)].f + 0.01) /
               (half::_toFloat[*(ushort *)((long)pvVar6 + uVar7 * 8 + 2)].f + 0.01);
      if ((fVar14 < 0.99) || (1.01 < fVar14)) {
        __assert_fail("approximatelyEqual (pixels1[i].g, pixels2[i].g)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                      ,0x82,"void (anonymous namespace)::compareImages(const char *, const char *)")
        ;
      }
      fVar14 = (half::_toFloat[*(ushort *)((long)pvVar5 + uVar7 * 8 + 4)].f + 0.01) /
               (half::_toFloat[*(ushort *)((long)pvVar6 + uVar7 * 8 + 4)].f + 0.01);
      if ((fVar14 < 0.99) || (1.01 < fVar14)) {
        __assert_fail("approximatelyEqual (pixels1[i].b, pixels2[i].b)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                      ,0x83,"void (anonymous namespace)::compareImages(const char *, const char *)")
        ;
      }
      fVar14 = (half::_toFloat[*(ushort *)((long)pvVar5 + uVar7 * 8 + 6)].f + 0.01) /
               (half::_toFloat[*(ushort *)((long)pvVar6 + uVar7 * 8 + 6)].f + 0.01);
      if ((fVar14 < 0.99) || (1.01 < fVar14)) {
        __assert_fail("approximatelyEqual (pixels1[i].a, pixels2[i].a)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                      ,0x84,"void (anonymous namespace)::compareImages(const char *, const char *)")
        ;
      }
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
  }
  operator_delete__(pvVar6);
  operator_delete__(pvVar5);
  Imf_2_5::RgbaInputFile::~RgbaInputFile(&local_68);
  Imf_2_5::RgbaInputFile::~RgbaInputFile(&local_a0);
  return;
}

Assistant:

void
compareImages (const char fileName1[], const char fileName2[])
{
    cout << "comparing files " << fileName1 << " and " << fileName2 << endl;

    OPENEXR_IMF_NAMESPACE::RgbaInputFile in1 (fileName1);
    OPENEXR_IMF_NAMESPACE::RgbaInputFile in2 (fileName1);

    assert (in1.dataWindow() == in2.dataWindow());

    const Box2i &dw = in1.dataWindow();

    int w = dw.max.x - dw.min.x + 1;
    int h = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels1 (w * h);
    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels2 (w * h);

    in1.setFrameBuffer (pixels1 - dx - dy * w, 1, w);
    in2.setFrameBuffer (pixels2 - dx - dy * w, 1, w);

    in1.readPixels (in1.dataWindow().min.y, in1.dataWindow().max.y);
    in2.readPixels (in2.dataWindow().min.y, in2.dataWindow().max.y);

    for (int i = 0; i < w * h; ++i)
    {
	assert (approximatelyEqual (pixels1[i].r, pixels2[i].r));
	assert (approximatelyEqual (pixels1[i].g, pixels2[i].g));
	assert (approximatelyEqual (pixels1[i].b, pixels2[i].b));
	assert (approximatelyEqual (pixels1[i].a, pixels2[i].a));
    }
}